

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O1

void erkStep_PrintMem(ARKodeMem ark_mem,FILE *outfile)

{
  void *pvVar1;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 != (void *)0x0) {
    fprintf((FILE *)outfile,"ERKStep: q = %i\n",(ulong)*(uint *)((long)pvVar1 + 0x10));
    fprintf((FILE *)outfile,"ERKStep: p = %i\n",(ulong)*(uint *)((long)pvVar1 + 0x14));
    fprintf((FILE *)outfile,"ERKStep: stages = %i\n",(ulong)*(uint *)((long)pvVar1 + 0x18));
    fprintf((FILE *)outfile,"ERKStep: nfe = %li\n",*(undefined8 *)((long)pvVar1 + 0x28));
    fwrite("ERKStep: Butcher table:\n",0x18,1,(FILE *)outfile);
    ARKodeButcherTable_Write(*(ARKodeButcherTable *)((long)pvVar1 + 0x20),outfile);
    return;
  }
  arkProcessError(ark_mem,-0x15,0x309,"erkStep_PrintMem",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                  ,"Time step module memory is NULL.");
  return;
}

Assistant:

void erkStep_PrintMem(ARKodeMem ark_mem, FILE* outfile)
{
  ARKodeERKStepMem step_mem;
  int retval;

#ifdef SUNDIALS_DEBUG_PRINTVEC
  int i;
#endif

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return; }

  /* output integer quantities */
  fprintf(outfile, "ERKStep: q = %i\n", step_mem->q);
  fprintf(outfile, "ERKStep: p = %i\n", step_mem->p);
  fprintf(outfile, "ERKStep: stages = %i\n", step_mem->stages);

  /* output long integer quantities */
  fprintf(outfile, "ERKStep: nfe = %li\n", step_mem->nfe);

  /* output sunrealtype quantities */
  fprintf(outfile, "ERKStep: Butcher table:\n");
  ARKodeButcherTable_Write(step_mem->B, outfile);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  /* output vector quantities */
  for (i = 0; i < step_mem->stages; i++)
  {
    fprintf(outfile, "ERKStep: F[%i]:\n", i);
    N_VPrintFile(step_mem->F[i], outfile);
  }
#endif
}